

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void boost::unordered::detail::foa::
     table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
     ::delete_(allocator_type al,
              table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
              *arrays)

{
  allocator_type sal;
  StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL> local_8;
  
  if (arrays->elements_ != (basic_string_view<char,_std::char_traits<char>_> *)0x0) {
    local_8.storage = al.storage;
    slang::detail::hashing::
    StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>::deallocate
              (&local_8,arrays->elements_,arrays->groups_size_mask * 0x10 + 0x10 & 0xffffffffffffff0
              );
  }
  return;
}

Assistant:

static void delete_(allocator_type al, table_arrays& arrays) noexcept {
        using storage_traits = std::allocator_traits<allocator_type>;

        auto sal = allocator_type(al);
        if (arrays.elements()) {
            storage_traits::deallocate(sal, arrays.elements_,
                                       buffer_size(arrays.groups_size_mask + 1));
        }
    }